

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

ssize_t __thiscall
sznet::net::KcpConnection::send(KcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  bool bVar1;
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  undefined1 local_c0 [56];
  code *local_88;
  undefined8 local_80;
  string local_78;
  Functor local_58;
  KcpConnection *local_38;
  
  if (this->m_state == kConnected) {
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar1) {
      sendInLoop(this,(StringPiece *)CONCAT44(in_register_00000034,__fd));
      return extraout_RAX;
    }
    local_88 = sendInLoop;
    local_80 = 0;
    this_00 = this->m_loop;
    local_38 = this;
    StringPiece::as_string_abi_cxx11_(&local_78,(StringPiece *)CONCAT44(in_register_00000034,__fd));
    std::
    _Bind<void(sznet::net::KcpConnection::*(sznet::net::KcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>
    ::_Bind<sznet::net::KcpConnection*,std::__cxx11::string>
              ((_Bind<void(sznet::net::KcpConnection::*(sznet::net::KcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>
                *)local_c0,(offset_in_KcpConnection_to_subr *)&local_88,&local_38,&local_78);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpConnection::*(sznet::net::KcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>,void>
              ((function<void()> *)&local_58,
               (_Bind<void_(sznet::net::KcpConnection::*(sznet::net::KcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
                *)local_c0);
    EventLoop::runInLoop(this_00,&local_58);
    std::_Function_base::~_Function_base(&local_58.super__Function_base);
    std::__cxx11::string::~string((string *)(local_c0 + 0x10));
    in_RAX = std::__cxx11::string::~string((string *)&local_78);
  }
  return in_RAX;
}

Assistant:

void KcpConnection::send(const StringPiece& message)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(message);
		}
		else
		{
			void (KcpConnection:: * fp)(const StringPiece & message) = &KcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, message.as_string()));
		}
	}
}